

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O2

void __thiscall Assimp::MDLImporter::InternReadFile_Quake1(MDLImporter *this)

{
  aiFace *paVar1;
  int iVar2;
  Header *pcHeader;
  int32_t iVar3;
  aiMesh *this_00;
  aiVector3D *paVar4;
  ulong *puVar5;
  aiFace *paVar6;
  aiNode *this_01;
  uint *puVar7;
  aiMesh **ppaVar8;
  Logger *this_02;
  DeadlyImportError *this_03;
  ulong uVar9;
  uint uVar10;
  ai_real aVar11;
  ai_real *paVar12;
  ulong uVar13;
  uint c;
  long lVar14;
  ai_real *paVar15;
  float fVar16;
  allocator local_79;
  ai_real *local_78;
  ai_real *local_70;
  long local_68;
  ulong local_60;
  Header *local_58;
  uint iSkip;
  
  if (this->pScene == (aiScene *)0x0) {
    __assert_fail("__null != pScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                  ,0x159,"void Assimp::MDLImporter::InternReadFile_Quake1()");
  }
  pcHeader = (Header *)this->mBuffer;
  ValidateHeader_Quake1(this,pcHeader);
  local_58 = pcHeader + 1;
  uVar10 = 0;
  while( true ) {
    if ((uint)pcHeader->num_skins <= uVar10) {
      paVar15 = local_58->scale + (long)pcHeader->num_verts * 3 + -2;
      iVar2 = pcHeader->num_tris;
      paVar12 = paVar15 + (long)iVar2 * 4;
      SizeCheck(this,paVar12,
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                ,0x192);
      if (paVar15[(long)iVar2 * 4] == 0.0) {
        local_70 = paVar12 + 1;
      }
      else {
        local_70 = *(ai_real **)(paVar12 + 5);
      }
      local_78 = paVar15;
      SizeCheck(this,local_70 + (long)pcHeader->num_verts + 6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                ,0x1a1);
      SetupMaterialProperties_3DGS_MDL5_Quake1(this);
      this_00 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(this_00);
      this_00->mPrimitiveTypes = 4;
      uVar10 = pcHeader->num_tris;
      uVar9 = (ulong)uVar10;
      this_00->mNumVertices = uVar10 * 3;
      this_00->mNumFaces = uVar10;
      uVar13 = (ulong)(uVar10 * 3) * 0xc;
      paVar4 = (aiVector3D *)operator_new__(uVar13);
      if (uVar9 != 0) {
        memset(paVar4,0,((uVar13 - 0xc) - (uVar13 - 0xc) % 0xc) + 0xc);
      }
      this_00->mVertices = paVar4;
      paVar4 = (aiVector3D *)operator_new__(uVar13);
      if (uVar9 != 0) {
        memset(paVar4,0,((uVar13 - 0xc) - (uVar13 - 0xc) % 0xc) + 0xc);
      }
      this_00->mTextureCoords[0] = paVar4;
      puVar5 = (ulong *)operator_new__(uVar9 * 0x10 + 8);
      paVar1 = (aiFace *)(puVar5 + 1);
      *puVar5 = uVar9;
      if (uVar9 != 0) {
        paVar6 = paVar1;
        do {
          paVar6->mNumIndices = 0;
          paVar6->mIndices = (uint *)0x0;
          paVar6 = paVar6 + 1;
        } while (paVar6 != paVar1 + uVar9);
      }
      this_00->mFaces = paVar1;
      paVar4 = (aiVector3D *)operator_new__(uVar13);
      if (uVar9 != 0) {
        memset(paVar4,0,((uVar13 - 0xc) - (uVar13 - 0xc) % 0xc) + 0xc);
      }
      this_00->mNormals = paVar4;
      this_00->mNumUVComponents[0] = 2;
      this_01 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_01);
      local_70 = local_70 + 6;
      this->pScene->mRootNode = this_01;
      this->pScene->mRootNode->mNumMeshes = 1;
      puVar7 = (uint *)operator_new__(4);
      this->pScene->mRootNode->mMeshes = puVar7;
      *this->pScene->mRootNode->mMeshes = 0;
      this->pScene->mNumMeshes = 1;
      ppaVar8 = (aiMesh **)operator_new__(8);
      this->pScene->mMeshes = ppaVar8;
      *this->pScene->mMeshes = this_00;
      uVar13 = 0;
      uVar9 = 0;
      paVar12 = local_78;
      while (uVar9 < (uint)pcHeader->num_tris) {
        local_78 = (ai_real *)uVar13;
        puVar7 = (uint *)operator_new__(0xc);
        local_68 = uVar9 * 0x10;
        this_00->mFaces[uVar9].mIndices = puVar7;
        this_00->mFaces[uVar9].mNumIndices = 3;
        local_60 = uVar9;
        for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
          uVar9 = (long)local_78 + lVar14;
          *(int *)(*(long *)((long)&this_00->mFaces->mIndices + local_68) + lVar14 * 4) = (int)uVar9
          ;
          aVar11 = paVar12[lVar14 + 1];
          if ((uint)pcHeader->num_verts <= (uint)aVar11) {
            aVar11 = (ai_real)(pcHeader->num_verts - 1);
            this_02 = DefaultLogger::get();
            Logger::warn(this_02,"Index overflow in Q1-MDL vertex list.");
          }
          paVar4 = this_00->mVertices;
          uVar13 = (ulong)(uint)aVar11;
          uVar9 = uVar9 & 0xffffffff;
          fVar16 = (float)*(byte *)(local_70 + uVar13) * pcHeader->scale[0];
          paVar4[uVar9].x = fVar16;
          paVar4[uVar9].x = fVar16 + pcHeader->translate[0];
          fVar16 = (float)*(byte *)((long)local_70 + uVar13 * 4 + 1) * pcHeader->scale[1];
          paVar4[uVar9].y = fVar16;
          paVar4[uVar9].y = fVar16 + pcHeader->translate[1];
          fVar16 = (float)*(byte *)((long)local_70 + uVar13 * 4 + 2) * pcHeader->scale[2];
          paVar4[uVar9].z = fVar16;
          paVar4[uVar9].z = fVar16 + pcHeader->translate[2];
          MD2::LookupNormalIndex
                    (*(uint8_t *)((long)local_70 + uVar13 * 4 + 3),this_00->mNormals + uVar9);
          fVar16 = (float)(int)local_58->scale[uVar13 * 3 + -1];
          aVar11 = local_58->scale[uVar13 * 3];
          if (*paVar12 == 0.0) {
            iVar3 = pcHeader->skinwidth;
            if (local_58->scale[uVar13 * 3 + -2] != 0.0) {
              fVar16 = fVar16 + (float)iVar3 * 0.5;
            }
          }
          else {
            iVar3 = pcHeader->skinwidth;
          }
          this_00->mTextureCoords[0][uVar9].x = (fVar16 + 0.5) / (float)iVar3;
          this_00->mTextureCoords[0][uVar9].y =
               1.0 - ((float)(int)aVar11 + 0.5) / (float)pcHeader->skinheight;
        }
        iVar2 = (int)local_78;
        **(int **)((long)&this_00->mFaces->mIndices + local_68) = iVar2 + 2;
        *(int *)(*(long *)((long)&this_00->mFaces->mIndices + local_68) + 4) = iVar2 + 1;
        *(int *)(*(long *)((long)&this_00->mFaces->mIndices + local_68) + 8) = iVar2;
        paVar12 = paVar12 + 4;
        uVar13 = (ulong)(iVar2 + 3);
        uVar9 = local_60 + 1;
      }
      return;
    }
    if (this->mBuffer + this->iFileSize < local_58->scale + 1) break;
    if (local_58->ident == 1) {
      uVar9 = (ulong)(uint)local_58->version;
      local_58 = (Header *)local_58->scale;
      if (uVar9 != 0) {
        if (uVar10 == 0) {
          CreateTextureARGB8_3DGS_MDL3(this,(uchar *)((long)local_58 + uVar9 * 4));
        }
        local_58 = (Header *)
                   ((long)local_58 +
                   (long)pcHeader->skinwidth * (long)pcHeader->skinheight + uVar9 * 4);
      }
    }
    else {
      iSkip = -(uint)(uVar10 != 0);
      CreateTexture_3DGS_MDL4(this,(uchar *)&local_58->version,local_58->ident,&iSkip);
      local_58 = (Header *)((ulong)iSkip + (long)&local_58->version);
    }
    uVar10 = uVar10 + 1;
  }
  this_03 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&iSkip,"[Quake 1 MDL] Unexpected EOF",&local_79);
  DeadlyImportError::DeadlyImportError(this_03,(string *)&iSkip);
  __cxa_throw(this_03,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MDLImporter::InternReadFile_Quake1() {
    ai_assert(NULL != pScene);

    BE_NCONST MDL::Header *pcHeader = (BE_NCONST MDL::Header*)this->mBuffer;

#ifdef AI_BUILD_BIG_ENDIAN
    FlipQuakeHeader(pcHeader);
#endif

    ValidateHeader_Quake1(pcHeader);

    // current cursor position in the file
    const unsigned char* szCurrent = (const unsigned char*)(pcHeader+1);

    // need to read all textures
    for ( unsigned int i = 0; i < (unsigned int)pcHeader->num_skins; ++i) {
        union {
            BE_NCONST MDL::Skin* pcSkin;
            BE_NCONST MDL::GroupSkin* pcGroupSkin;
        };
        if (szCurrent + sizeof(MDL::Skin) > this->mBuffer + this->iFileSize) {
            throw DeadlyImportError("[Quake 1 MDL] Unexpected EOF");
        }
        pcSkin = (BE_NCONST MDL::Skin*)szCurrent;

        AI_SWAP4( pcSkin->group );

        // Quake 1 group-skins
        if (1 == pcSkin->group) {
            AI_SWAP4( pcGroupSkin->nb );

            // need to skip multiple images
            const unsigned int iNumImages = (unsigned int)pcGroupSkin->nb;
            szCurrent += sizeof(uint32_t) * 2;

            if (0 != iNumImages) {
                if (!i) {
                    // however, create only one output image (the first)
                    this->CreateTextureARGB8_3DGS_MDL3(szCurrent + iNumImages * sizeof(float));
                }
                // go to the end of the skin section / the beginning of the next skin
                szCurrent += pcHeader->skinheight * pcHeader->skinwidth +
                    sizeof(float) * iNumImages;
            }
        } else {
            szCurrent += sizeof(uint32_t);
            unsigned int iSkip = i ? UINT_MAX : 0;
            CreateTexture_3DGS_MDL4(szCurrent,pcSkin->group,&iSkip);
            szCurrent += iSkip;
        }
    }
    // get a pointer to the texture coordinates
    BE_NCONST MDL::TexCoord* pcTexCoords = (BE_NCONST MDL::TexCoord*)szCurrent;
    szCurrent += sizeof(MDL::TexCoord) * pcHeader->num_verts;

    // get a pointer to the triangles
    BE_NCONST MDL::Triangle* pcTriangles = (BE_NCONST MDL::Triangle*)szCurrent;
    szCurrent += sizeof(MDL::Triangle) * pcHeader->num_tris;
    VALIDATE_FILE_SIZE(szCurrent);

    // now get a pointer to the first frame in the file
    BE_NCONST MDL::Frame* pcFrames = (BE_NCONST MDL::Frame*)szCurrent;
    MDL::SimpleFrame* pcFirstFrame;

    if (0 == pcFrames->type) {
        // get address of single frame
        pcFirstFrame =( MDL::SimpleFrame*) &pcFrames->frame;
    } else {
        // get the first frame in the group
        BE_NCONST MDL::GroupFrame* pcFrames2 = (BE_NCONST MDL::GroupFrame*) pcFrames;
        pcFirstFrame = &(pcFrames2->frames[0]);
    }
    BE_NCONST MDL::Vertex* pcVertices = (BE_NCONST MDL::Vertex*) ((pcFirstFrame->name) + sizeof(pcFirstFrame->name));
    VALIDATE_FILE_SIZE((const unsigned char*)(pcVertices + pcHeader->num_verts));

#ifdef AI_BUILD_BIG_ENDIAN
    for (int i = 0; i<pcHeader->num_verts;++i)
    {
        AI_SWAP4( pcTexCoords[i].onseam );
        AI_SWAP4( pcTexCoords[i].s );
        AI_SWAP4( pcTexCoords[i].t );
    }

    for (int i = 0; i<pcHeader->num_tris;++i)
    {
        AI_SWAP4( pcTriangles[i].facesfront);
        AI_SWAP4( pcTriangles[i].vertex[0]);
        AI_SWAP4( pcTriangles[i].vertex[1]);
        AI_SWAP4( pcTriangles[i].vertex[2]);
    }
#endif

    // setup materials
    SetupMaterialProperties_3DGS_MDL5_Quake1();

    // allocate enough storage to hold all vertices and triangles
    aiMesh* pcMesh = new aiMesh();

    pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
    pcMesh->mNumVertices = pcHeader->num_tris * 3;
    pcMesh->mNumFaces = pcHeader->num_tris;
    pcMesh->mVertices = new aiVector3D[pcMesh->mNumVertices];
    pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
    pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];
    pcMesh->mNormals = new aiVector3D[pcMesh->mNumVertices];
    pcMesh->mNumUVComponents[0] = 2;

    // there won't be more than one mesh inside the file
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mNumMeshes = 1;
    pScene->mRootNode->mMeshes = new unsigned int[1];
    pScene->mRootNode->mMeshes[0] = 0;
    pScene->mNumMeshes = 1;
    pScene->mMeshes = new aiMesh*[1];
    pScene->mMeshes[0] = pcMesh;

    // now iterate through all triangles
    unsigned int iCurrent = 0;
    for (unsigned int i = 0; i < (unsigned int) pcHeader->num_tris;++i)
    {
        pcMesh->mFaces[i].mIndices = new unsigned int[3];
        pcMesh->mFaces[i].mNumIndices = 3;

        unsigned int iTemp = iCurrent;
        for (unsigned int c = 0; c < 3;++c,++iCurrent)
        {
            pcMesh->mFaces[i].mIndices[c] = iCurrent;

            // read vertices
            unsigned int iIndex = pcTriangles->vertex[c];
            if (iIndex >= (unsigned int)pcHeader->num_verts)
            {
                iIndex = pcHeader->num_verts-1;
                ASSIMP_LOG_WARN("Index overflow in Q1-MDL vertex list.");
            }

            aiVector3D& vec = pcMesh->mVertices[iCurrent];
            vec.x = (float)pcVertices[iIndex].v[0] * pcHeader->scale[0];
            vec.x += pcHeader->translate[0];

            vec.y = (float)pcVertices[iIndex].v[1] * pcHeader->scale[1];
            vec.y += pcHeader->translate[1];
            //vec.y *= -1.0f;

            vec.z = (float)pcVertices[iIndex].v[2] * pcHeader->scale[2];
            vec.z += pcHeader->translate[2];

            // read the normal vector from the precalculated normal table
            MD2::LookupNormalIndex(pcVertices[iIndex].normalIndex,pcMesh->mNormals[iCurrent]);
            //pcMesh->mNormals[iCurrent].y *= -1.0f;

            // read texture coordinates
            float s = (float)pcTexCoords[iIndex].s;
            float t = (float)pcTexCoords[iIndex].t;

            // translate texture coordinates
            if (0 == pcTriangles->facesfront && 0 != pcTexCoords[iIndex].onseam)    {
                s += pcHeader->skinwidth * 0.5f;
            }

            // Scale s and t to range from 0.0 to 1.0
            pcMesh->mTextureCoords[0][iCurrent].x = (s + 0.5f) / pcHeader->skinwidth;
            pcMesh->mTextureCoords[0][iCurrent].y = 1.0f-(t + 0.5f) / pcHeader->skinheight;

        }
        pcMesh->mFaces[i].mIndices[0] = iTemp+2;
        pcMesh->mFaces[i].mIndices[1] = iTemp+1;
        pcMesh->mFaces[i].mIndices[2] = iTemp+0;
        pcTriangles++;
    }
    return;
}